

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O3

SQInteger __thiscall SQLexer::AddUTF8(SQLexer *this,SQUnsignedInteger ch)

{
  SQUnsignedInteger SVar1;
  char *pcVar2;
  SQInteger SVar3;
  ulong uVar4;
  byte bVar5;
  SQUnsignedInteger SVar6;
  
  bVar5 = (byte)ch;
  if (ch < 0x80) {
    SVar1 = (this->_longstr)._allocated;
    pcVar2 = (this->_longstr)._vals;
    uVar4 = (this->_longstr)._size;
    if (SVar1 <= uVar4) {
      SVar6 = 4;
      if (uVar4 * 2 != 0) {
        SVar6 = uVar4 * 2;
      }
      pcVar2 = (char *)sq_vm_realloc(pcVar2,SVar1,SVar6);
      (this->_longstr)._vals = pcVar2;
      (this->_longstr)._allocated = SVar6;
      uVar4 = (this->_longstr)._size;
    }
    (this->_longstr)._size = uVar4 + 1;
    pcVar2[uVar4] = bVar5;
    SVar3 = 1;
  }
  else if (ch < 0x800) {
    SVar1 = (this->_longstr)._allocated;
    pcVar2 = (this->_longstr)._vals;
    uVar4 = (this->_longstr)._size;
    if (SVar1 <= uVar4) {
      SVar6 = 4;
      if (uVar4 * 2 != 0) {
        SVar6 = uVar4 * 2;
      }
      pcVar2 = (char *)sq_vm_realloc(pcVar2,SVar1,SVar6);
      (this->_longstr)._vals = pcVar2;
      (this->_longstr)._allocated = SVar6;
      uVar4 = (this->_longstr)._size;
    }
    (this->_longstr)._size = uVar4 + 1;
    pcVar2[uVar4] = (byte)(ch >> 6) | 0xc0;
    SVar1 = (this->_longstr)._allocated;
    pcVar2 = (this->_longstr)._vals;
    uVar4 = (this->_longstr)._size;
    if (SVar1 <= uVar4) {
      SVar6 = 4;
      if (uVar4 * 2 != 0) {
        SVar6 = uVar4 * 2;
      }
      pcVar2 = (char *)sq_vm_realloc(pcVar2,SVar1,SVar6);
      (this->_longstr)._vals = pcVar2;
      (this->_longstr)._allocated = SVar6;
      uVar4 = (this->_longstr)._size;
    }
    (this->_longstr)._size = uVar4 + 1;
    pcVar2[uVar4] = bVar5 & 0x3f | 0x80;
    SVar3 = 2;
  }
  else if (ch < 0x10000) {
    SVar1 = (this->_longstr)._allocated;
    pcVar2 = (this->_longstr)._vals;
    uVar4 = (this->_longstr)._size;
    if (SVar1 <= uVar4) {
      SVar6 = 4;
      if (uVar4 * 2 != 0) {
        SVar6 = uVar4 * 2;
      }
      pcVar2 = (char *)sq_vm_realloc(pcVar2,SVar1,SVar6);
      (this->_longstr)._vals = pcVar2;
      (this->_longstr)._allocated = SVar6;
      uVar4 = (this->_longstr)._size;
    }
    (this->_longstr)._size = uVar4 + 1;
    pcVar2[uVar4] = (byte)(ch >> 0xc) | 0xe0;
    SVar1 = (this->_longstr)._allocated;
    pcVar2 = (this->_longstr)._vals;
    uVar4 = (this->_longstr)._size;
    if (SVar1 <= uVar4) {
      SVar6 = 4;
      if (uVar4 * 2 != 0) {
        SVar6 = uVar4 * 2;
      }
      pcVar2 = (char *)sq_vm_realloc(pcVar2,SVar1,SVar6);
      (this->_longstr)._vals = pcVar2;
      (this->_longstr)._allocated = SVar6;
      uVar4 = (this->_longstr)._size;
    }
    (this->_longstr)._size = uVar4 + 1;
    pcVar2[uVar4] = (byte)(ch >> 6) & 0x3f | 0x80;
    SVar1 = (this->_longstr)._allocated;
    pcVar2 = (this->_longstr)._vals;
    uVar4 = (this->_longstr)._size;
    if (SVar1 <= uVar4) {
      SVar6 = 4;
      if (uVar4 * 2 != 0) {
        SVar6 = uVar4 * 2;
      }
      pcVar2 = (char *)sq_vm_realloc(pcVar2,SVar1,SVar6);
      (this->_longstr)._vals = pcVar2;
      (this->_longstr)._allocated = SVar6;
      uVar4 = (this->_longstr)._size;
    }
    (this->_longstr)._size = uVar4 + 1;
    pcVar2[uVar4] = bVar5 & 0x3f | 0x80;
    SVar3 = 3;
  }
  else if ("orIPS5_S7_EEDpOT_" < ch) {
    SVar3 = 0;
  }
  else {
    SVar1 = (this->_longstr)._allocated;
    pcVar2 = (this->_longstr)._vals;
    uVar4 = (this->_longstr)._size;
    if (SVar1 <= uVar4) {
      SVar6 = 4;
      if (uVar4 * 2 != 0) {
        SVar6 = uVar4 * 2;
      }
      pcVar2 = (char *)sq_vm_realloc(pcVar2,SVar1,SVar6);
      (this->_longstr)._vals = pcVar2;
      (this->_longstr)._allocated = SVar6;
      uVar4 = (this->_longstr)._size;
    }
    (this->_longstr)._size = uVar4 + 1;
    pcVar2[uVar4] = (byte)(ch >> 0x12) | 0xf0;
    SVar1 = (this->_longstr)._allocated;
    pcVar2 = (this->_longstr)._vals;
    uVar4 = (this->_longstr)._size;
    if (SVar1 <= uVar4) {
      SVar6 = 4;
      if (uVar4 * 2 != 0) {
        SVar6 = uVar4 * 2;
      }
      pcVar2 = (char *)sq_vm_realloc(pcVar2,SVar1,SVar6);
      (this->_longstr)._vals = pcVar2;
      (this->_longstr)._allocated = SVar6;
      uVar4 = (this->_longstr)._size;
    }
    (this->_longstr)._size = uVar4 + 1;
    pcVar2[uVar4] = (byte)(ch >> 0xc) & 0x3f | 0x80;
    SVar1 = (this->_longstr)._allocated;
    pcVar2 = (this->_longstr)._vals;
    uVar4 = (this->_longstr)._size;
    if (SVar1 <= uVar4) {
      SVar6 = 4;
      if (uVar4 * 2 != 0) {
        SVar6 = uVar4 * 2;
      }
      pcVar2 = (char *)sq_vm_realloc(pcVar2,SVar1,SVar6);
      (this->_longstr)._vals = pcVar2;
      (this->_longstr)._allocated = SVar6;
      uVar4 = (this->_longstr)._size;
    }
    (this->_longstr)._size = uVar4 + 1;
    pcVar2[uVar4] = (byte)(ch >> 6) & 0x3f | 0x80;
    SVar1 = (this->_longstr)._allocated;
    pcVar2 = (this->_longstr)._vals;
    uVar4 = (this->_longstr)._size;
    if (SVar1 <= uVar4) {
      SVar6 = 4;
      if (uVar4 * 2 != 0) {
        SVar6 = uVar4 * 2;
      }
      pcVar2 = (char *)sq_vm_realloc(pcVar2,SVar1,SVar6);
      (this->_longstr)._vals = pcVar2;
      (this->_longstr)._allocated = SVar6;
      uVar4 = (this->_longstr)._size;
    }
    (this->_longstr)._size = uVar4 + 1;
    pcVar2[uVar4] = bVar5 & 0x3f | 0x80;
    SVar3 = 4;
  }
  return SVar3;
}

Assistant:

SQInteger SQLexer::AddUTF8(SQUnsignedInteger ch)
{
    if (ch < 0x80) {
        APPEND_CHAR((char)ch);
        return 1;
    }
    if (ch < 0x800) {
        APPEND_CHAR((SQChar)((ch >> 6) | 0xC0));
        APPEND_CHAR((SQChar)((ch & 0x3F) | 0x80));
        return 2;
    }
    if (ch < 0x10000) {
        APPEND_CHAR((SQChar)((ch >> 12) | 0xE0));
        APPEND_CHAR((SQChar)(((ch >> 6) & 0x3F) | 0x80));
        APPEND_CHAR((SQChar)((ch & 0x3F) | 0x80));
        return 3;
    }
    if (ch < 0x110000) {
        APPEND_CHAR((SQChar)((ch >> 18) | 0xF0));
        APPEND_CHAR((SQChar)(((ch >> 12) & 0x3F) | 0x80));
        APPEND_CHAR((SQChar)(((ch >> 6) & 0x3F) | 0x80));
        APPEND_CHAR((SQChar)((ch & 0x3F) | 0x80));
        return 4;
    }
    return 0;
}